

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void cfd::core::MergePsbtInputs(wally_psbt *psbt,wally_psbt *psbt_dest,bool ignore_duplicate_error)

{
  size_type *psVar1;
  char *pcVar2;
  uint uVar3;
  long lVar4;
  void *pvVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  bool bVar9;
  undefined8 *puVar10;
  CfdException *pCVar11;
  uint uVar12;
  undefined7 in_register_00000011;
  wally_tx_input *pwVar13;
  long *plVar14;
  undefined8 uVar15;
  char *pcVar16;
  ulong uVar17;
  wally_tx_input *pwVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string item_key;
  string __str_1;
  Txid txid;
  vector<unsigned_long,_std::allocator<unsigned_long>_> append_indexes;
  int ret;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  string local_100;
  char **local_e0;
  uint local_d8;
  undefined4 uStack_d4;
  char *local_d0 [2];
  wally_psbt *local_c0;
  unsigned_long local_b8;
  uint local_ac;
  undefined1 local_a8 [16];
  _func_int *local_98 [2];
  string local_88;
  undefined1 local_68 [16];
  unsigned_long *local_58;
  long local_50;
  wally_psbt *local_48;
  int local_3c;
  long *local_38;
  
  local_58 = (unsigned_long *)0x0;
  local_68 = (undefined1  [16])0x0;
  local_b8 = 0;
  local_50 = CONCAT44(local_50._4_4_,(int)CONCAT71(in_register_00000011,ignore_duplicate_error));
  local_ac = (uint)ignore_duplicate_error;
  local_c0 = psbt_dest;
  local_48 = psbt;
  if (psbt_dest->num_inputs != 0) {
    do {
      if (psbt->num_inputs == 0) {
LAB_0048dd2b:
        if ((unsigned_long *)local_68._8_8_ == local_58) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_68,
                     (iterator)local_68._8_8_,&local_b8);
        }
        else {
          *(unsigned_long *)local_68._8_8_ = local_b8;
          local_68._8_8_ = (unsigned_long *)(local_68._8_8_ + 8);
        }
      }
      else {
        pwVar13 = local_c0->tx->inputs + local_b8;
        bVar9 = false;
        uVar17 = 0;
        do {
          pwVar18 = psbt->tx->inputs;
          bVar6 = true;
          if (pwVar18[uVar17].index == pwVar13->index) {
            pwVar18 = pwVar18 + uVar17;
            auVar20[0] = -(pwVar13->txhash[0] == pwVar18->txhash[0]);
            auVar20[1] = -(pwVar13->txhash[1] == pwVar18->txhash[1]);
            auVar20[2] = -(pwVar13->txhash[2] == pwVar18->txhash[2]);
            auVar20[3] = -(pwVar13->txhash[3] == pwVar18->txhash[3]);
            auVar20[4] = -(pwVar13->txhash[4] == pwVar18->txhash[4]);
            auVar20[5] = -(pwVar13->txhash[5] == pwVar18->txhash[5]);
            auVar20[6] = -(pwVar13->txhash[6] == pwVar18->txhash[6]);
            auVar20[7] = -(pwVar13->txhash[7] == pwVar18->txhash[7]);
            auVar20[8] = -(pwVar13->txhash[8] == pwVar18->txhash[8]);
            auVar20[9] = -(pwVar13->txhash[9] == pwVar18->txhash[9]);
            auVar20[10] = -(pwVar13->txhash[10] == pwVar18->txhash[10]);
            auVar20[0xb] = -(pwVar13->txhash[0xb] == pwVar18->txhash[0xb]);
            auVar20[0xc] = -(pwVar13->txhash[0xc] == pwVar18->txhash[0xc]);
            auVar20[0xd] = -(pwVar13->txhash[0xd] == pwVar18->txhash[0xd]);
            auVar20[0xe] = -(pwVar13->txhash[0xe] == pwVar18->txhash[0xe]);
            auVar20[0xf] = -(pwVar13->txhash[0xf] == pwVar18->txhash[0xf]);
            auVar19[0] = -(pwVar13->txhash[0x10] == pwVar18->txhash[0x10]);
            auVar19[1] = -(pwVar13->txhash[0x11] == pwVar18->txhash[0x11]);
            auVar19[2] = -(pwVar13->txhash[0x12] == pwVar18->txhash[0x12]);
            auVar19[3] = -(pwVar13->txhash[0x13] == pwVar18->txhash[0x13]);
            auVar19[4] = -(pwVar13->txhash[0x14] == pwVar18->txhash[0x14]);
            auVar19[5] = -(pwVar13->txhash[0x15] == pwVar18->txhash[0x15]);
            auVar19[6] = -(pwVar13->txhash[0x16] == pwVar18->txhash[0x16]);
            auVar19[7] = -(pwVar13->txhash[0x17] == pwVar18->txhash[0x17]);
            auVar19[8] = -(pwVar13->txhash[0x18] == pwVar18->txhash[0x18]);
            auVar19[9] = -(pwVar13->txhash[0x19] == pwVar18->txhash[0x19]);
            auVar19[10] = -(pwVar13->txhash[0x1a] == pwVar18->txhash[0x1a]);
            auVar19[0xb] = -(pwVar13->txhash[0x1b] == pwVar18->txhash[0x1b]);
            auVar19[0xc] = -(pwVar13->txhash[0x1c] == pwVar18->txhash[0x1c]);
            auVar19[0xd] = -(pwVar13->txhash[0x1d] == pwVar18->txhash[0x1d]);
            auVar19[0xe] = -(pwVar13->txhash[0x1e] == pwVar18->txhash[0x1e]);
            auVar19[0xf] = -(pwVar13->txhash[0x1f] == pwVar18->txhash[0x1f]);
            auVar19 = auVar19 & auVar20;
            if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
              ByteData::ByteData((ByteData *)local_120,pwVar18->txhash,0x20);
              ByteData256::ByteData256((ByteData256 *)&local_100,(ByteData *)local_120);
              Txid::Txid((Txid *)local_a8,(ByteData256 *)&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity -
                                (long)local_100._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete((void *)local_120._0_8_,
                                local_110._M_allocated_capacity - local_120._0_8_);
              }
              Txid::GetHex_abi_cxx11_(&local_88,(Txid *)local_a8);
              local_120._0_8_ = &local_110;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)local_120,local_88._M_dataplus._M_p,
                         local_88._M_dataplus._M_p + local_88._M_string_length);
              ::std::__cxx11::string::append((char *)local_120);
              uVar3 = pwVar18->index;
              cVar8 = '\x01';
              if (9 < uVar3) {
                uVar12 = uVar3;
                cVar7 = '\x04';
                do {
                  cVar8 = cVar7;
                  if (uVar12 < 100) {
                    cVar8 = cVar8 + -2;
                    goto LAB_0048db4b;
                  }
                  if (uVar12 < 1000) {
                    cVar8 = cVar8 + -1;
                    goto LAB_0048db4b;
                  }
                  if (uVar12 < 10000) goto LAB_0048db4b;
                  bVar9 = 99999 < uVar12;
                  uVar12 = uVar12 / 10000;
                  cVar7 = cVar8 + '\x04';
                } while (bVar9);
                cVar8 = cVar8 + '\x01';
              }
LAB_0048db4b:
              local_e0 = local_d0;
              ::std::__cxx11::string::_M_construct((ulong)&local_e0,cVar8);
              ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e0,local_d8,uVar3);
              uVar15 = (char *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._0_8_ != &local_110) {
                uVar15 = local_110._M_allocated_capacity;
              }
              pcVar2 = (char *)(CONCAT44(uStack_d4,local_d8) +
                               CONCAT44(local_120._12_4_,local_120._8_4_));
              if ((ulong)uVar15 < pcVar2) {
                pcVar16 = (char *)0xf;
                if (local_e0 != local_d0) {
                  pcVar16 = local_d0[0];
                }
                if (pcVar16 < pcVar2) goto LAB_0048dbbf;
                puVar10 = (undefined8 *)
                          ::std::__cxx11::string::replace
                                    ((ulong)&local_e0,0,(char *)0x0,local_120._0_8_);
              }
              else {
LAB_0048dbbf:
                puVar10 = (undefined8 *)
                          ::std::__cxx11::string::_M_append((char *)local_120,(ulong)local_e0);
              }
              psVar1 = puVar10 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_100.field_2._M_allocated_capacity = *psVar1;
                local_100.field_2._8_8_ = puVar10[3];
                local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              }
              else {
                local_100.field_2._M_allocated_capacity = *psVar1;
                local_100._M_dataplus._M_p = (pointer)*puVar10;
              }
              local_100._M_string_length = puVar10[1];
              *puVar10 = psVar1;
              puVar10[1] = 0;
              *(undefined1 *)psVar1 = 0;
              if (local_e0 != local_d0) {
                operator_delete(local_e0,(ulong)(local_d0[0] + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_120._0_8_ != &local_110) {
                operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              if (pwVar18->sequence != pwVar13->sequence && (char)local_50 == '\0') {
                local_120._0_8_ = "cfdcore_psbt.cpp";
                local_120._8_4_ = 0x26b;
                local_110._M_allocated_capacity = 0x6e5bd0;
                logger::log<std::__cxx11::string&>
                          ((CfdSourceLocation *)local_120,kCfdLogLevelWarning,
                           "psbt sequence duplicate. [{}]",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_100);
                pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
                local_120._0_8_ = &local_110;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_120,"psbt sequence duplicate error.","");
                CfdException::CfdException(pCVar11,kCfdIllegalArgumentError,(string *)local_120);
                __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
              }
              MergePsbtInputItem(local_48->inputs + uVar17,local_c0->inputs + local_b8,
                                 SUB41(local_ac,0),&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              psbt = local_48;
              local_a8._0_8_ = &PTR__Txid_007e3348;
              pvVar5 = (void *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
              if (pvVar5 != (void *)0x0) {
                operator_delete(pvVar5,(long)local_98[1] - (long)pvVar5);
              }
              bVar9 = true;
              bVar6 = false;
            }
          }
        } while ((bVar6) && (uVar17 = uVar17 + 1, uVar17 < psbt->num_inputs));
        if (!bVar9) goto LAB_0048dd2b;
      }
      local_b8 = local_b8 + 1;
    } while (local_b8 < local_c0->num_inputs);
  }
  local_38 = (long *)local_68._8_8_;
  if (local_68._0_8_ != local_68._8_8_) {
    plVar14 = (long *)local_68._0_8_;
    do {
      lVar4 = *plVar14;
      uVar17 = psbt->num_inputs;
      local_50 = lVar4;
      local_3c = wally_psbt_add_input_at(psbt,(uint32_t)uVar17,1,local_c0->tx->inputs + lVar4);
      if (local_3c != 0) {
        local_a8._0_8_ = "cfdcore_psbt.cpp";
        local_a8._8_4_ = 0x27f;
        local_98[0] = (_func_int *)0x6e5bd0;
        logger::log<int&>((CfdSourceLocation *)local_a8,kCfdLogLevelWarning,
                          "wally_psbt_add_input_at NG[{}]",&local_3c);
        pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
        local_a8._0_8_ = local_a8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a8,"psbt add global unkonwns error.","");
        CfdException::CfdException(pCVar11,kCfdMemoryFullError,(string *)local_a8);
        __cxa_throw(pCVar11,&CfdException::typeinfo,CfdException::~CfdException);
      }
      pwVar13 = local_c0->tx->inputs + lVar4;
      ByteData::ByteData((ByteData *)local_120,pwVar13->txhash,0x20);
      ByteData256::ByteData256((ByteData256 *)&local_100,(ByteData *)local_120);
      Txid::Txid((Txid *)local_a8,(ByteData256 *)&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_100._M_dataplus._M_p,
                        local_100.field_2._M_allocated_capacity - (long)local_100._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity - local_120._0_8_);
      }
      Txid::GetHex_abi_cxx11_(&local_88,(Txid *)local_a8);
      local_120._0_8_ = &local_110;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_120,local_88._M_dataplus._M_p,
                 local_88._M_dataplus._M_p + local_88._M_string_length);
      ::std::__cxx11::string::append((char *)local_120);
      uVar3 = pwVar13->index;
      cVar8 = '\x01';
      if (9 < uVar3) {
        uVar12 = uVar3;
        cVar7 = '\x04';
        do {
          cVar8 = cVar7;
          if (uVar12 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_0048defd;
          }
          if (uVar12 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_0048defd;
          }
          if (uVar12 < 10000) goto LAB_0048defd;
          bVar9 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar7 = cVar8 + '\x04';
        } while (bVar9);
        cVar8 = cVar8 + '\x01';
      }
LAB_0048defd:
      local_e0 = local_d0;
      ::std::__cxx11::string::_M_construct((ulong)&local_e0,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_e0,local_d8,uVar3);
      uVar15 = (char *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ != &local_110) {
        uVar15 = local_110._M_allocated_capacity;
      }
      pcVar2 = (char *)(CONCAT44(uStack_d4,local_d8) + CONCAT44(local_120._12_4_,local_120._8_4_));
      if ((ulong)uVar15 < pcVar2) {
        pcVar16 = (char *)0xf;
        if (local_e0 != local_d0) {
          pcVar16 = local_d0[0];
        }
        if (pcVar16 < pcVar2) goto LAB_0048df6d;
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::replace((ulong)&local_e0,0,(char *)0x0,local_120._0_8_);
      }
      else {
LAB_0048df6d:
        puVar10 = (undefined8 *)::std::__cxx11::string::_M_append(local_120,(ulong)local_e0);
      }
      psVar1 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_100.field_2._M_allocated_capacity = *psVar1;
        local_100.field_2._8_8_ = puVar10[3];
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar1;
        local_100._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_100._M_string_length = puVar10[1];
      *puVar10 = psVar1;
      puVar10[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_e0 != local_d0) {
        operator_delete(local_e0,(ulong)(local_d0[0] + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ != &local_110) {
        operator_delete((void *)local_120._0_8_,local_110._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      psbt = local_48;
      MergePsbtInputItem(local_48->inputs + (uVar17 & 0xffffffff),local_c0->inputs + local_50,
                         SUB41(local_ac,0),&local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      local_a8._0_8_ = &PTR__Txid_007e3348;
      pvVar5 = (void *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_98[1] - (long)pvVar5);
      }
      plVar14 = plVar14 + 1;
    } while (plVar14 != local_38);
  }
  if ((void *)local_68._0_8_ != (void *)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
  }
  return;
}

Assistant:

void MergePsbtInputs(
    struct wally_psbt *psbt, const struct wally_psbt *psbt_dest,
    bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> append_indexes;
  for (size_t dst_idx = 0; dst_idx < psbt_dest->num_inputs; ++dst_idx) {
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < psbt->num_inputs; ++src_idx) {
      auto src_txin = &psbt->tx->inputs[src_idx];
      if ((src_txin->index == dest_txin->index) &&
          (memcmp(
               src_txin->txhash, dest_txin->txhash,
               sizeof(src_txin->txhash)) == 0)) {
        is_find = true;
        Txid txid(ByteData256(ByteData(
            src_txin->txhash,
            static_cast<uint32_t>(sizeof(src_txin->txhash)))));
        std::string item_key =
            txid.GetHex() + "," + std::to_string(src_txin->index);
        if (src_txin->sequence == dest_txin->sequence) {
          // do nothing
        } else if (ignore_duplicate_error) {
          // do nothing
        } else {
          warn(CFD_LOG_SOURCE, "psbt sequence duplicate. [{}]", item_key);
          throw CfdException(
              kCfdIllegalArgumentError, "psbt sequence duplicate error.");
        }
        MergePsbtInputItem(
            &psbt->inputs[src_idx], &psbt_dest->inputs[dst_idx],
            ignore_duplicate_error, item_key);
        break;
      }
    }
    if (!is_find) append_indexes.push_back(dst_idx);
  }

  uint32_t index;
  for (auto dst_idx : append_indexes) {
    index = static_cast<uint32_t>(psbt->num_inputs);
    ret = wally_psbt_add_input_at(
        psbt, index, WALLY_PSBT_FLAG_NON_FINAL,
        &psbt_dest->tx->inputs[dst_idx]);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_add_input_at NG[{}]", ret);
      throw CfdException(
          kCfdMemoryFullError, "psbt add global unkonwns error.");
    }
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    Txid txid(ByteData256(ByteData(
        dest_txin->txhash, static_cast<uint32_t>(sizeof(dest_txin->txhash)))));
    std::string item_key =
        txid.GetHex() + "," + std::to_string(dest_txin->index);
    MergePsbtInputItem(
        &psbt->inputs[index], &psbt_dest->inputs[dst_idx],
        ignore_duplicate_error, item_key);
  }
}